

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::MeshLoader::loadSourceElement(MeshLoader *this,InputShared *input)

{
  Semantic *pSVar1;
  InputUnshared *in_RSI;
  Semantic semantic;
  bool retValue;
  InputShared *in_stack_00000190;
  MeshLoader *in_stack_00000198;
  InputShared *in_stack_00000210;
  MeshLoader *in_stack_00000218;
  bool local_11;
  
  pSVar1 = InputUnshared::getSemantic(in_RSI);
  switch(*pSVar1) {
  case COLOR:
    local_11 = loadColorsSourceElement(in_stack_00000198,in_stack_00000190);
    break;
  default:
    local_11 = false;
    break;
  case NORMAL:
    local_11 = loadNormalsSourceElement(in_stack_00000218,in_stack_00000210);
    break;
  case POSITION:
    local_11 = loadPositionsSourceElement(in_stack_00000218,in_stack_00000210);
    break;
  case TEXBINORMAL:
    local_11 = loadTexBinormalSourceElement(in_stack_00000198,in_stack_00000190);
    break;
  case TEXCOORD:
  case UV:
    local_11 = loadTexCoordsSourceElement(in_stack_00000198,in_stack_00000190);
    break;
  case TEXTANGENT:
    local_11 = loadTexTangentSourceElement(in_stack_00000198,in_stack_00000190);
  }
  return local_11;
}

Assistant:

bool MeshLoader::loadSourceElement ( const InputShared& input )
    {
        bool retValue = false;

        // Get the semantic of the current input element.
        InputSemantic::Semantic semantic = input.getSemantic ();
        switch ( semantic )
        {
        case InputSemantic::POSITION:
            retValue = loadPositionsSourceElement ( input );
            break;
        case InputSemantic::NORMAL:
            retValue = loadNormalsSourceElement ( input );
            break;
        case InputSemantic::COLOR:
            retValue = loadColorsSourceElement ( input );
            break;
        case InputSemantic::UV:
        case InputSemantic::TEXCOORD:
            retValue = loadTexCoordsSourceElement ( input );
            break;
        case InputSemantic::TEXTANGENT:
            retValue = loadTexTangentSourceElement( input );
            break;
        case InputSemantic::TEXBINORMAL:
            retValue = loadTexBinormalSourceElement( input );
            break;
        default:
            // Not implemented source
//            std::cerr << "Source with semantic " << semantic << "not implemented!" << std::endl;
            retValue = false;
        }

        return retValue;
    }